

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O0

void __thiscall
QDirIteratorPrivate::QDirIteratorPrivate
          (QDirIteratorPrivate *this,QString *path,QStringList *nameFilters,Filters filters,
          IteratorFlags flags)

{
  QString *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  QDirIteratorPrivate *in_RDI;
  long in_FS_OFFSET;
  EVP_PKEY_CTX *this_00;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  QStringList *in_stack_ffffffffffffffd0;
  EVP_PKEY_CTX *this_01;
  QFlags<QDirIterator::IteratorFlag> local_10;
  QFlags<QDir::Filter> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RSI;
  QFlags<QDir::Filter>::toInt(&local_c);
  QFlags<QDirIterator::IteratorFlag>::toInt(&local_10);
  this_00 = in_RSI;
  QDirListing::QDirListing
            ((QDirListing *)this_01,in_RDX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  (in_RDI->it).dirEntry.dirListPtr = (QDirListingPrivate *)0x0;
  QDirListing::const_iterator::const_iterator((const_iterator *)0x2a1d7d);
  QFileInfo::QFileInfo((QFileInfo *)this_00);
  QFileInfo::QFileInfo((QFileInfo *)this_00);
  init(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirIteratorPrivate(const QString &path, const QStringList &nameFilters = {},
                        QDir::Filters filters = QDir::NoFilter,
                        QDirIterator::IteratorFlags flags = QDirIterator::NoIteratorFlags)
        : lister(path, nameFilters, filters.toInt(), flags.toInt())
    { init(); }